

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O1

Lexeme * BinaryCache::GetLexems(char *path,uint *count)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  
  uVar1 = NULLC::GetStringHash(path);
  if (DAT_0042ef2c != 0) {
    puVar2 = (uint *)(cache + 0x20);
    uVar3 = 0;
    do {
      if (uVar1 == puVar2[-6]) {
        *count = *puVar2;
        if (uVar3 < DAT_0042ef2c) {
          return *(Lexeme **)(puVar2 + -2);
        }
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<BinaryCache::CodeDescriptor>::operator[](unsigned int) [T = BinaryCache::CodeDescriptor, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      uVar3 = uVar3 + 1;
      puVar2 = puVar2 + 10;
    } while (DAT_0042ef2c != uVar3);
  }
  return (Lexeme *)0x0;
}

Assistant:

Lexeme* BinaryCache::GetLexems(const char* path, unsigned& count)
{
	unsigned int hash = NULLC::GetStringHash(path);
	for(unsigned int i = 0; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
		{
			count = cache[i].lexemeCount;
			return cache[i].lexemes;
		}
	}
	return NULL;
}